

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FLog.cpp
# Opt level: O2

void FLog::mfree(time_t dateTime,int line,string *function,string *file)

{
  id __id;
  char *pcVar1;
  ostream *poVar2;
  time_t dateTime_local;
  string timeTemp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  string temp;
  string local_498;
  string local_478;
  string local_458;
  string local_438;
  string local_418;
  string local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  string threadIdStr;
  mutex locker;
  ostringstream sstream;
  
  dateTime_local = dateTime;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&sstream);
  __id._M_thread = pthread_self();
  std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&sstream,__id);
  std::__cxx11::stringbuf::str();
  if ((int)logLevel < 2) {
    if (printAll != false || printWarning != false) {
      pcVar1 = ctime(&dateTime_local);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&timeTemp,pcVar1,(allocator<char> *)&locker);
      std::__cxx11::string::replace((ulong)&timeTemp,timeTemp._M_string_length - 1,(char *)0x1);
      std::operator+(&local_3d8," [DateTime: ",&timeTemp);
      std::operator+(&local_3b8,&local_3d8," ] ");
      std::operator+(&local_398,&local_3b8," [Type: Free ] ");
      std::operator+(&local_378,&local_398," [Line: ");
      std::__cxx11::to_string(&local_3f8,line);
      std::operator+(&local_358,&local_378,&local_3f8);
      std::operator+(&local_338,&local_358," ] ");
      std::operator+(&local_318,&local_338," [Function: ");
      std::operator+(&local_2f8,&local_318,function);
      std::operator+(&local_2d8,&local_2f8," ] ");
      std::operator+(&local_2b8,&local_2d8," [Thread Id: ");
      std::operator+(&local_298,&local_2b8,&threadIdStr);
      std::operator+(&local_278,&local_298," ] ");
      std::operator+(&local_4d8,&local_278," [File: ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&locker,
                     &local_4d8,file);
      std::operator+(&temp,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &locker," ] ");
      std::__cxx11::string::~string((string *)&locker);
      std::__cxx11::string::~string((string *)&local_4d8);
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::string::~string((string *)&local_298);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::__cxx11::string::~string((string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_318);
      std::__cxx11::string::~string((string *)&local_338);
      std::__cxx11::string::~string((string *)&local_358);
      std::__cxx11::string::~string((string *)&local_3f8);
      std::__cxx11::string::~string((string *)&local_378);
      std::__cxx11::string::~string((string *)&local_398);
      std::__cxx11::string::~string((string *)&local_3b8);
      std::__cxx11::string::~string((string *)&local_3d8);
      locker.super___mutex_base._M_mutex._16_8_ = 0;
      locker.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
      locker.super___mutex_base._M_mutex.__align = 0;
      locker.super___mutex_base._M_mutex._8_8_ = 0;
      locker.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
      std::mutex::lock(&locker);
      poVar2 = std::operator<<((ostream *)&std::clog,(string *)&temp);
      std::endl<char,std::char_traits<char>>(poVar2);
      pthread_mutex_unlock((pthread_mutex_t *)&locker);
      std::__cxx11::string::~string((string *)&temp);
      std::__cxx11::string::~string((string *)&timeTemp);
    }
    pcVar1 = ctime(&dateTime_local);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_418,pcVar1,(allocator<char> *)&timeTemp);
    std::__cxx11::to_string(&local_438,line);
    std::__cxx11::string::string((string *)&local_458,(string *)file);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_478,"Free ",(allocator<char> *)&temp);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_498,"warning",(allocator<char> *)&local_4d8);
    FONQRI::Log::Log((Log *)&locker,&local_418,&local_438,&local_458,&local_478,&local_498);
    std::vector<FONQRI::Log,_std::allocator<FONQRI::Log>_>::emplace_back<FONQRI::Log>
              (&normalLogList,(Log *)&locker);
    FONQRI::Log::~Log((Log *)&locker);
    std::__cxx11::string::~string((string *)&local_498);
    std::__cxx11::string::~string((string *)&local_478);
    std::__cxx11::string::~string((string *)&local_458);
    std::__cxx11::string::~string((string *)&local_438);
    std::__cxx11::string::~string((string *)&local_418);
  }
  std::__cxx11::string::~string((string *)&threadIdStr);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&sstream);
  return;
}

Assistant:

void FLog::mfree(const time_t dateTime, int line, std::string function,
		 std::string file)
{

	// get thread id and convert it to string
	std::ostringstream sstream;
	sstream << std::this_thread::get_id();
	std::string threadIdStr = sstream.str();

	if (logLevel < FLog::important) {
		if (FLog::printWarning | FLog::printAll) {
			std::string timeTemp = std::string(std::ctime(&dateTime));
			timeTemp.replace(timeTemp.size() - 1, 1, "");
			std::string temp =
			" [DateTime: " + timeTemp + " ] " + " [Type: Free ] " +
			" [Line: " + std::to_string(line) + " ] " +
			" [Function: " + function + " ] " + " [Thread Id: " +
			threadIdStr + " ] " + " [File: " + file + " ] ";
			std::mutex locker;
			locker.lock();
			std::clog << temp << std::endl;
			locker.unlock();
		}
		FLog::normalLogList.push_back(
		FONQRI::Log(std::string(std::ctime(&dateTime)),
				std::to_string(line), file, "Free ", "warning"));

		if (FLog::normalLogList.size() >= FLog::logCounts) {
			// NOTE you can save save normalLogList  to database
		}
	}
}